

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

void Curl_pgrsSetDownloadCounter(Curl_easy *data,curl_off_t size)

{
  long lVar1;
  timeval now_00;
  timeval now;
  __time_t local_20;
  __suseconds_t _Stack_18;
  
  now_00 = curlx_tvnow();
  (data->progress).downloaded = size;
  lVar1 = (data->set).max_recv_speed;
  if (0 < lVar1) {
    local_20 = now_00.tv_sec;
    _Stack_18 = now_00.tv_usec;
    lVar1 = Curl_pgrsLimitWaitTime
                      (size,(data->progress).dl_limit_size,lVar1,(data->progress).dl_limit_start,
                       now_00);
    if (lVar1 == 0) {
      (data->progress).dl_limit_start.tv_sec = local_20;
      (data->progress).dl_limit_start.tv_usec = _Stack_18;
      (data->progress).dl_limit_size = size;
    }
  }
  return;
}

Assistant:

void Curl_pgrsSetDownloadCounter(struct Curl_easy *data, curl_off_t size)
{
  struct timeval now = Curl_tvnow();

  data->progress.downloaded = size;

  /* download speed limit */
  if((data->set.max_recv_speed > 0) &&
     (Curl_pgrsLimitWaitTime(data->progress.downloaded,
                             data->progress.dl_limit_size,
                             data->set.max_recv_speed,
                             data->progress.dl_limit_start,
                             now) == 0)) {
    data->progress.dl_limit_start = now;
    data->progress.dl_limit_size = size;
  }
}